

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::Pow::dim_forward
          (Dim *__return_storage_ptr__,Pow *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  uint uVar2;
  pointer pDVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  invalid_argument *this_00;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  int iVar26;
  Dim r;
  string asStack_1b8 [32];
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 uStack_184;
  undefined8 local_17c;
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar3 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x307,"virtual Dim cnn::Pow::dim_forward(const vector<Dim> &) const");
  }
  iVar26 = 1;
  __return_storage_ptr__->bd = pDVar3->bd;
  uVar13 = 1;
  uVar7 = *(undefined8 *)(pDVar3->d + 2);
  uVar10 = *(undefined8 *)(pDVar3->d + 4);
  uVar11 = *(undefined8 *)(pDVar3->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar3->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar7;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar10;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar11;
  uVar2 = pDVar3->nd;
  if ((ulong)uVar2 != 0) {
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar18);
      auVar18 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar3->d + uVar15));
      auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar18 = vpmulld_avx512f(auVar22,auVar23);
    } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
    auVar19 = vmovdqa32_avx512f(auVar18);
    auVar18._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar18._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar18._60_4_ =
         (uint)(bVar9 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar18,1);
    auVar18 = vpmulld_avx512f(auVar18,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar26 = auVar5._0_4_;
  }
  uVar12 = iVar26 * pDVar3->bd;
  if (1 < uVar12) {
    uVar14 = 1;
    uVar13 = 1;
    do {
      if ((uVar14 < uVar2) && (1 < pDVar3->d[uVar14])) {
        uVar13 = uVar14 + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar12);
  }
  __return_storage_ptr__->nd = uVar13;
  pDVar1 = pDVar3 + 1;
  uVar2 = pDVar3[1].nd;
  if ((ulong)uVar2 == 0) {
    iVar26 = 1;
  }
  else {
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar18);
      auVar18 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1->d + uVar15));
      auVar24._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
      auVar24._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
      auVar24._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
      auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
      auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
      auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
      auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
      auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
      auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
      auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar18 = vpmulld_avx512f(auVar24,auVar23);
    } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar15);
    auVar18 = vmovdqa32_avx512f(auVar18);
    auVar19._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar19._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar19._60_4_ =
         (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpmulld_avx512f(auVar19,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar26 = auVar5._0_4_;
  }
  uVar13 = iVar26 * pDVar3[1].bd;
  if (uVar13 < 2) {
    uStack_188 = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 3) >> 0x20);
    uStack_184 = *(undefined8 *)(pDVar3[1].d + 5);
    local_198 = *(undefined8 *)pDVar1->d;
    uStack_190 = (undefined4)*(undefined8 *)(pDVar3[1].d + 2);
    uStack_18c = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 2) >> 0x20);
    local_17c = 0x100000001;
    uVar12 = 1;
  }
  else {
    uVar14 = 1;
    uVar12 = 1;
    do {
      if ((uVar14 < uVar2) && (1 < pDVar1->d[uVar14])) {
        uVar12 = uVar14 + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar13);
    uStack_188 = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 3) >> 0x20);
    uStack_184 = *(undefined8 *)(pDVar3[1].d + 5);
    local_198 = *(undefined8 *)pDVar1->d;
    uStack_190 = (undefined4)*(undefined8 *)(pDVar3[1].d + 2);
    uStack_18c = (undefined4)((ulong)*(undefined8 *)(pDVar3[1].d + 2) >> 0x20);
    local_17c = CONCAT44(1,uVar12);
    if (uVar12 == 0) {
      return __return_storage_ptr__;
    }
  }
  auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar21 = vpbroadcastq_avx512f();
  uVar15 = 0;
  do {
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vmovdqa64_avx512f(auVar18);
    auVar18 = vporq_avx512f(auVar22,auVar19);
    auVar22 = vporq_avx512f(auVar22,auVar20);
    uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
    bVar8 = (byte)uVar7;
    uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
    bVar9 = (byte)uVar7;
    uVar16 = CONCAT11(bVar9,bVar8);
    auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&local_198 + uVar15 * 4));
    auVar25._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
    auVar25._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
    auVar25._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
    auVar25._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
    auVar25._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
    auVar25._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
    auVar25._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
    auVar25._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
    auVar25._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
    auVar25._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
    auVar25._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
    auVar25._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
    auVar25._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
    auVar25._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
    auVar25._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
    auVar25._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
    uVar15 = uVar15 + 0x10;
    auVar18 = vpmulld_avx512f(auVar25,auVar23);
  } while (((ulong)uVar12 + 0xf & 0x1fffffff0) != uVar15);
  auVar18 = vmovdqa32_avx512f(auVar18);
  auVar20._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
  bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
  auVar20._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar23._4_4_;
  bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
  auVar20._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar23._8_4_;
  bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
  auVar20._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar23._12_4_;
  bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
  auVar20._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar23._16_4_;
  bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
  auVar20._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar23._20_4_;
  bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
  auVar20._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar23._24_4_;
  bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
  auVar20._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar23._28_4_;
  auVar20._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
  bVar4 = (bool)(bVar9 >> 1 & 1);
  auVar20._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar23._36_4_;
  bVar4 = (bool)(bVar9 >> 2 & 1);
  auVar20._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar23._40_4_;
  bVar4 = (bool)(bVar9 >> 3 & 1);
  auVar20._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar23._44_4_;
  bVar4 = (bool)(bVar9 >> 4 & 1);
  auVar20._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar23._48_4_;
  bVar4 = (bool)(bVar9 >> 5 & 1);
  auVar20._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar23._52_4_;
  bVar4 = (bool)(bVar9 >> 6 & 1);
  auVar20._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar23._56_4_;
  auVar20._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
  auVar17 = vextracti64x4_avx512f(auVar20,1);
  auVar18 = vpmulld_avx512f(auVar20,ZEXT3264(auVar17));
  auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
  auVar6 = vpshufd_avx(auVar5,0xee);
  auVar5 = vpmulld_avx(auVar5,auVar6);
  auVar6 = vpshufd_avx(auVar5,0x55);
  auVar5 = vpmulld_avx(auVar5,auVar6);
  if (auVar5._0_4_ == 1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Bad input dimensions in Pow: ",0x1d);
  operator<<((ostream *)&local_198,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}